

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_agree_crypt(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *crypt,
                   size_t crypt_len)

{
  LIBSSH2_CRYPT_METHOD **methodlist;
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_CRYPT_METHOD *pLVar3;
  size_t sVar4;
  int iVar5;
  _func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *needle;
  
  methodlist = libssh2_crypt_methods();
  needle = session->addLocalIdentities;
  if (needle == (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0) {
    do {
      pLVar3 = *methodlist;
      if (pLVar3 == (LIBSSH2_CRYPT_METHOD *)0x0) {
        return -1;
      }
      puVar2 = (uchar *)pLVar3->name;
      if (puVar2 == (uchar *)0x0) {
        return -1;
      }
      sVar4 = strlen((char *)puVar2);
      puVar2 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)crypt,puVar2,sVar4);
      methodlist = methodlist + 1;
    } while (puVar2 == (uchar *)0x0);
LAB_0010f094:
    session->free = (_func_void_void_ptr_void_ptr_ptr *)pLVar3;
    iVar5 = 0;
  }
  else {
    while ((needle != (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0 &&
           (*needle != (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr)0x0))) {
      pcVar1 = strchr((char *)needle,0x2c);
      if (pcVar1 == (char *)0x0) {
        sVar4 = strlen((char *)needle);
      }
      else {
        sVar4 = (long)pcVar1 - (long)needle;
      }
      puVar2 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)crypt,(uchar *)needle,sVar4);
      if (puVar2 != (uchar *)0x0) {
        pLVar3 = (LIBSSH2_CRYPT_METHOD *)
                 kex_get_method_by_name((char *)needle,sVar4,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar3 == (LIBSSH2_CRYPT_METHOD *)0x0) {
          return -1;
        }
        goto LAB_0010f094;
      }
      needle = (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)(pcVar1 + 1);
      if (pcVar1 == (char *)0x0) {
        needle = (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0;
      }
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int kex_agree_crypt(LIBSSH2_SESSION * session,
                           libssh2_endpoint_data *endpoint,
                           unsigned char *crypt,
                           size_t crypt_len)
{
    const LIBSSH2_CRYPT_METHOD **cryptp = libssh2_crypt_methods();
    unsigned char *s;

    (void)session;

    if(endpoint->crypt_prefs) {
        s = (unsigned char *) endpoint->crypt_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(crypt, crypt_len, s, method_len)) {
                const LIBSSH2_CRYPT_METHOD *method =
                    (const LIBSSH2_CRYPT_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           cryptp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->crypt = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*cryptp && (*cryptp)->name) {
        s = _libssh2_kex_agree_instr(crypt, crypt_len,
                                     (const unsigned char *) (*cryptp)->name,
                                     strlen((*cryptp)->name));
        if(s) {
            endpoint->crypt = *cryptp;
            return 0;
        }
        cryptp++;
    }

    return -1;
}